

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

Phdr * __thiscall pstack::Elf::Object::getSegmentForAddress(Object *this,Off a)

{
  bool bVar1;
  bool bVar2;
  pointer pEVar3;
  reference pEVar4;
  __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
  local_50 [2];
  Elf64_Phdr *local_40;
  Elf64_Phdr *local_38;
  __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
  local_30;
  __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_> pos;
  ProgramHeaders *hdrs;
  Off a_local;
  Object *this_local;
  
  if (((this->lastSegmentForAddress == (Phdr *)0x0) || (a < this->lastSegmentForAddress->p_vaddr))
     || (this->lastSegmentForAddress->p_vaddr + this->lastSegmentForAddress->p_memsz <= a)) {
    hdrs = (ProgramHeaders *)a;
    a_local = (Off)this;
    pos._M_current = (Elf64_Phdr *)getSegments(this,1);
    local_38 = (Elf64_Phdr *)
               std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::begin
                         ((vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_> *)pos._M_current);
    local_40 = (Elf64_Phdr *)
               std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::end(pos._M_current);
    local_30 = std::
               lower_bound<__gnu_cxx::__normal_iterator<Elf64_Phdr_const*,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>>,unsigned_long,pstack::Elf::Object::getSegmentForAddress(unsigned_long)const::__0>
                         (local_38,local_40,&hdrs);
    local_50[0]._M_current =
         (Elf64_Phdr *)std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::end(pos._M_current);
    bVar2 = __gnu_cxx::
            operator==<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                      (&local_30,local_50);
    bVar1 = false;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
               ::operator->(&local_30);
      bVar1 = (ProgramHeaders *)pEVar3->p_vaddr <= hdrs;
    }
    if (bVar1) {
      pEVar4 = __gnu_cxx::
               __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
               ::operator*(&local_30);
      this->lastSegmentForAddress = pEVar4;
      this_local = (Object *)this->lastSegmentForAddress;
    }
    else {
      this_local = (Object *)0x0;
    }
  }
  else {
    this_local = (Object *)this->lastSegmentForAddress;
  }
  return (Phdr *)this_local;
}

Assistant:

const Phdr *
Object::getSegmentForAddress(Off a) const
{
    if (lastSegmentForAddress != nullptr &&
          lastSegmentForAddress->p_vaddr <= a &&
          lastSegmentForAddress->p_vaddr + lastSegmentForAddress->p_memsz > a)
       return lastSegmentForAddress;
    const auto &hdrs = getSegments(PT_LOAD);

    auto pos = std::lower_bound(hdrs.begin(), hdrs.end(), a,
            [] (const Elf::Phdr &header, Elf::Off addr) {
            return header.p_vaddr + header.p_memsz <= addr; });
    if (pos != hdrs.end() && pos->p_vaddr <= a) {
        lastSegmentForAddress = &*pos;
        return lastSegmentForAddress;
    }
    return nullptr;
}